

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode NodeId_decodeBinary(UA_NodeId *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  uint uVar2;
  UA_UInt32 *pUVar3;
  UA_UInt32 *pUVar4;
  uint uVar5;
  UA_UInt32 *pUVar6;
  UA_UInt32 UVar7;
  UA_UInt16 UVar8;
  
  pUVar4 = (UA_UInt32 *)end;
  pUVar1 = pos;
  pUVar3 = (UA_UInt32 *)(pos + 1);
  if (end < pUVar3) {
    return 0x80070000;
  }
  switch(*pos) {
  case '\0':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    if (pUVar4 < pUVar1 + 2) {
      uVar2 = 0x80070000;
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)(byte)*pUVar3;
      uVar2 = 0;
      pos = pUVar1 + 2;
    }
    (dst->identifier).numeric = uVar5;
    dst->namespaceIndex = 0;
    break;
  case '\x01':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    pUVar6 = (UA_UInt32 *)(pUVar1 + 2);
    uVar2 = 0x80070000;
    UVar7 = 0;
    if (pUVar4 < pUVar6) {
      UVar8 = 0;
      uVar5 = 0x80070000;
      pUVar6 = pUVar3;
    }
    else {
      UVar8 = (UA_UInt16)(byte)*pUVar3;
      uVar5 = 0;
      pos = (UA_Byte *)pUVar6;
    }
    dst->namespaceIndex = UVar8;
    if ((ushort *)((long)pUVar6 + 2U) <= pUVar4) {
      UVar7 = (UA_UInt32)(ushort)*pUVar6;
      uVar2 = 0;
      pos = (UA_Byte *)((long)pUVar6 + 2U);
    }
    uVar2 = uVar2 | uVar5;
    (dst->identifier).numeric = UVar7;
    break;
  case '\x02':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    uVar2 = 0x80070000;
    if (pUVar4 < pUVar1 + 3) {
      uVar5 = 0x80070000;
    }
    else {
      dst->namespaceIndex = (ushort)*pUVar3;
      pUVar3 = (UA_UInt32 *)(pos + 2);
      uVar5 = 0;
      pUVar4 = (UA_UInt32 *)end;
      pos = (UA_Byte *)pUVar3;
    }
    if (pUVar3 + 1 <= pUVar4) {
      (dst->identifier).numeric = *pUVar3;
      uVar2 = 0;
      pos = (UA_Byte *)(pUVar3 + 1);
    }
    uVar2 = uVar2 | uVar5;
    break;
  case '\x03':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_STRING;
    uVar5 = 0x80070000;
    if ((UA_DataType *)(pUVar1 + 3) <= pUVar4) {
      dst->namespaceIndex = (ushort)*pUVar3;
      pos = pos + 2;
      uVar5 = 0;
    }
    uVar2 = String_decodeBinary(&(dst->identifier).string,(UA_DataType *)(pUVar1 + 3));
    goto LAB_00111c27;
  case '\x04':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_GUID;
    uVar5 = 0x80070000;
    if ((UA_DataType *)(pUVar1 + 3) <= pUVar4) {
      dst->namespaceIndex = (ushort)*pUVar3;
      pos = pos + 2;
      uVar5 = 0;
    }
    uVar2 = Guid_decodeBinary(&(dst->identifier).guid,(UA_DataType *)(pUVar1 + 3));
    goto LAB_00111c27;
  case '\x05':
    pos = (UA_Byte *)pUVar3;
    dst->identifierType = UA_NODEIDTYPE_BYTESTRING;
    uVar5 = 0x80070000;
    if (pUVar1 + 3 <= pUVar4) {
      dst->namespaceIndex = (ushort)*pUVar3;
      pos = pos + 2;
      uVar5 = 0;
    }
    uVar2 = ByteString_decodeBinary(&(dst->identifier).byteString);
LAB_00111c27:
    uVar2 = uVar2 | uVar5;
    break;
  default:
    uVar2 = 0x80020000;
    pos = (UA_Byte *)pUVar3;
  }
  return uVar2;
}

Assistant:

static UA_StatusCode
NodeId_decodeBinary(UA_NodeId *dst, const UA_DataType *_) {
    UA_Byte dstByte = 0, encodingByte = 0;
    UA_UInt16 dstUInt16 = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    switch (encodingByte) {
    case UA_NODEIDTYPE_NUMERIC_TWOBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval = Byte_decodeBinary(&dstByte, NULL);
        dst->identifier.numeric = dstByte;
        dst->namespaceIndex = 0;
        break;
    case UA_NODEIDTYPE_NUMERIC_FOURBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= Byte_decodeBinary(&dstByte, NULL);
        dst->namespaceIndex = dstByte;
        retval |= UInt16_decodeBinary(&dstUInt16, NULL);
        dst->identifier.numeric = dstUInt16;
        break;
    case UA_NODEIDTYPE_NUMERIC_COMPLETE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= UInt32_decodeBinary(&dst->identifier.numeric, NULL);
        break;
    case UA_NODEIDTYPE_STRING:
        dst->identifierType = UA_NODEIDTYPE_STRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= String_decodeBinary(&dst->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        dst->identifierType = UA_NODEIDTYPE_GUID;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= Guid_decodeBinary(&dst->identifier.guid, NULL);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        dst->identifierType = UA_NODEIDTYPE_BYTESTRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= ByteString_decodeBinary(&dst->identifier.byteString);
        break;
    default:
        retval |= UA_STATUSCODE_BADINTERNALERROR;
        break;
    }
    return retval;
}